

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O1

void test_stringparser_updatewidthnumber(void)

{
  runtime_error *prVar1;
  long width;
  stringstream msg;
  string asStack_1c8 [32];
  long local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  local_1a8 = 0;
  StringParser::updateWidthNumber<short>(1,&local_1a8);
  if (local_1a8 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"StringParser::updateWidthNumber failed on updating short",0x38);
    std::endl<char,std::char_traits<char>>(local_190);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar1,asStack_1c8);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<int>(1,&local_1a8);
  if (local_1a8 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"StringParser::updateWidthNumber failed on updating int",0x36);
    std::endl<char,std::char_traits<char>>(local_190);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar1,asStack_1c8);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<long>(1,&local_1a8);
  if (local_1a8 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"StringParser::updateWidthNumber failed on updating long",0x37);
    std::endl<char,std::char_traits<char>>(local_190);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar1,asStack_1c8);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  StringParser::updateWidthNumber<long_long>(1,&local_1a8);
  if (local_1a8 == 1) {
    StringParser::updateWidthNumber<float>(1.0,&local_1a8);
    if (local_1a8 != 8) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,"StringParser::updateWidthNumber failed on updating float",0x38);
      std::endl<char,std::char_traits<char>>(local_190);
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar1,asStack_1c8);
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    StringParser::updateWidthNumber<double>(1.0,&local_1a8);
    if (local_1a8 == 8) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"StringParser::updateWidthNumber failed on updating double",0x39);
    std::endl<char,std::char_traits<char>>(local_190);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar1,asStack_1c8);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"StringParser::updateWidthNumber failed on updating long long",0x3c);
  std::endl<char,std::char_traits<char>>(local_190);
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar1,asStack_1c8);
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_stringparser_updatewidthnumber()
{

    long width = 0;
    StringParser::updateWidthNumber<short>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating short");
    StringParser::updateWidthNumber<int>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating int");
    StringParser::updateWidthNumber<long>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating long");
    StringParser::updateWidthNumber<long long>(1, width);
    ASSERT_EQUAL(width, 1, "StringParser::updateWidthNumber failed on updating long long");
    StringParser::updateWidthNumber<float>(1, width);
    ASSERT_EQUAL(width, 8, "StringParser::updateWidthNumber failed on updating float");
    StringParser::updateWidthNumber<double>(1, width);
    ASSERT_EQUAL(width, 8, "StringParser::updateWidthNumber failed on updating double");

}